

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

uint32_t miniply::triangulate_polygon(uint32_t n,float *pos,uint32_t numVerts,int *indices,int *dst)

{
  uint uVar1;
  uint uVar2;
  Vec2 VVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  undefined4 in_register_0000003c;
  ulong uVar8;
  uint32_t uVar9;
  ulong uVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar11;
  undefined4 uVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Vec3 VVar16;
  Vec3 v;
  Vec3 lhs;
  Vec3 rhs;
  allocator_type local_ed;
  float local_ec;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ulong local_d8;
  value_type_conflict2 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> next;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> points2D;
  float local_58;
  float fStack_54;
  
  uVar9 = 0;
  if (2 < n) {
    if (n == 3) {
      *dst = *indices;
      dst[1] = indices[1];
      dst[2] = indices[2];
LAB_001047a4:
      uVar9 = 1;
    }
    else if (n == 4) {
      *dst = *indices;
      dst[1] = indices[1];
      dst[2] = indices[3];
      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      uVar9 = 2;
    }
    else {
      uVar8 = (ulong)n;
      uVar5 = 0;
      uVar9 = 0;
      do {
        if (uVar8 == uVar5) {
          local_c8 = *(int **)(pos + (long)*indices * 3);
          uStack_c0 = 0;
          local_ec = pos[(long)*indices * 3 + 2];
          uVar12 = 0;
          uVar14 = 0;
          uVar15 = 0;
          VVar16.x = (float)*(undefined8 *)(pos + (long)indices[1] * 3) - SUB84(local_c8,0);
          VVar16.y = (float)((ulong)*(undefined8 *)(pos + (long)indices[1] * 3) >> 0x20) -
                     (float)((ulong)local_c8 >> 0x20);
          VVar16.z = pos[(long)indices[1] * 3 + 2] - local_ec;
          VVar16 = normalize(VVar16);
          local_e8._0_4_ = VVar16.z;
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_8_ = VVar16._0_8_;
          local_b8._12_4_ = extraout_XMM0_Dd;
          uVar10 = (ulong)(n - 1);
          v.x = (float)*(undefined8 *)(pos + (long)indices[uVar10] * 3) - (float)local_c8;
          v.y = (float)((ulong)*(undefined8 *)(pos + (long)indices[uVar10] * 3) >> 0x20) -
                local_c8._4_4_;
          v.z = pos[(long)indices[uVar10] * 3 + 2] - local_ec;
          uStack_e0 = uVar14;
          uStack_dc = uVar15;
          local_d8 = CONCAT44(in_register_0000003c,n);
          local_e8._4_4_ = uVar12;
          VVar16 = normalize(v);
          auVar4 = local_b8._0_16_;
          lhs.z = (float)local_e8;
          lhs.x = (float)local_b8._0_4_;
          lhs.y = (float)local_b8._4_4_;
          local_b8._0_16_ = auVar4;
          VVar16 = cross(lhs,VVar16);
          VVar16 = normalize(VVar16);
          auVar4 = local_b8._0_16_;
          rhs.z = (float)local_e8;
          rhs.x = (float)local_b8._0_4_;
          rhs.y = (float)local_b8._4_4_;
          local_b8._0_16_ = auVar4;
          VVar16 = cross(VVar16,rhs);
          VVar16 = normalize(VVar16);
          next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::vector
                    (&points2D,uVar8,(value_type *)&next,(allocator_type *)&prev);
          local_58 = VVar16.x;
          fStack_54 = VVar16.y;
          for (uVar5 = 1; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            fVar11 = (float)*(undefined8 *)(pos + (long)indices[uVar5] * 3) - (float)local_c8;
            fVar13 = (float)((ulong)*(undefined8 *)(pos + (long)indices[uVar5] * 3) >> 0x20) -
                     local_c8._4_4_;
            VVar3.y = (pos[(long)indices[uVar5] * 3 + 2] - local_ec) * VVar16.z +
                      fVar11 * local_58 + fVar13 * fStack_54;
            VVar3.x = (pos[(long)indices[uVar5] * 3 + 2] - local_ec) * (float)local_e8 +
                      fVar11 * (float)local_b8._0_4_ + fVar13 * (float)local_b8._4_4_;
            points2D.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = VVar3;
          }
          prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&next,uVar8,(value_type_conflict2 *)&prev,(allocator_type *)&local_cc);
          local_cc = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&prev,uVar8,&local_cc,&local_ed);
          lVar6 = CONCAT44(prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_);
          for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = (uint)uVar5;
            *(int *)(lVar6 + uVar5 * 4) = (int)uVar10;
            uVar10 = uVar5 & 0xffffffff;
          }
          uVar8 = 0;
          uVar5 = local_d8;
          local_e8 = dst;
          local_c8 = indices;
          while (uVar9 = (uint32_t)uVar8, 3 < (uint)uVar5) {
            local_d8 = uVar5;
            fVar11 = angle_at_vert(uVar9,&points2D,&prev,&next);
            puVar7 = next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar8;
            uVar5 = uVar8;
            while( true ) {
              uVar1 = *puVar7;
              if (uVar1 == uVar9) break;
              local_b8._0_4_ = fVar11;
              fVar13 = angle_at_vert(uVar1,&points2D,&prev,&next);
              fVar11 = (float)local_b8._0_4_;
              if (fVar13 < (float)local_b8._0_4_) {
                uVar5 = (ulong)uVar1;
                fVar11 = fVar13;
              }
              puVar7 = next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar1;
            }
            uVar1 = next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
            lVar6 = CONCAT44(prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_);
            uVar2 = *(uint *)(lVar6 + uVar5 * 4);
            *local_e8 = local_c8[uVar5];
            local_e8[1] = local_c8[uVar1];
            local_e8[2] = local_c8[uVar2];
            local_e8 = local_e8 + 3;
            if ((uint32_t)uVar5 == uVar9) {
              uVar8 = (ulong)uVar1;
            }
            next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2] = uVar1;
            *(uint *)(lVar6 + (ulong)uVar1 * 4) = uVar2;
            uVar5 = (ulong)((int)local_d8 - 1);
          }
          *local_e8 = local_c8[uVar8];
          local_e8[1] = local_c8[next.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar8]];
          local_e8[2] = local_c8[*(uint *)(lVar6 + uVar8 * 4)];
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&next.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::_Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>::~_Vector_base
                    (&points2D.super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>);
          goto LAB_001047a4;
        }
        puVar7 = (uint *)(indices + uVar5);
      } while ((-1 < (int)*puVar7) && (uVar5 = uVar5 + 1, *puVar7 < numVerts));
    }
  }
  return uVar9;
}

Assistant:

uint32_t triangulate_polygon(uint32_t n, const float pos[], uint32_t numVerts, const int indices[], int dst[])
  {
    if (n < 3) {
      return 0;
    }
    else if (n == 3) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[2];
      return 1;
    }
    else if (n == 4) {
      dst[0] = indices[0];
      dst[1] = indices[1];
      dst[2] = indices[3];

      dst[3] = indices[2];
      dst[4] = indices[3];
      dst[5] = indices[1];
      return 2;
    }

    // Check that all indices for this face are in the valid range before we
    // try to dereference them.
    for (uint32_t i = 0; i < n; i++) {
      if (indices[i] < 0 || uint32_t(indices[i]) >= numVerts) {
        return 0;
      }
    }

    const Vec3* vpos = reinterpret_cast<const Vec3*>(pos);

    // Calculate the geometric normal of the face
    Vec3 origin = vpos[indices[0]];
    Vec3 faceU = normalize(vpos[indices[1]] - origin);
    Vec3 faceNormal = normalize(cross(faceU, normalize(vpos[indices[n - 1]] - origin)));
    Vec3 faceV = normalize(cross(faceNormal, faceU));

    // Project the faces points onto the plane perpendicular to the normal.
    std::vector<Vec2> points2D(n, Vec2{0.0f, 0.0f});
    for (uint32_t i = 1; i < n; i++) {
      Vec3 p = vpos[indices[i]] - origin;
      points2D[i] = Vec2{dot(p, faceU), dot(p, faceV)};
    }

    std::vector<uint32_t> next(n, 0u);
    std::vector<uint32_t> prev(n, 0u);
    uint32_t first = 0;
    for (uint32_t i = 0, j = n - 1; i < n; i++) {
      next[j] = i;
      prev[i] = j;
      j = i;
    }

    // Do ear clipping.
    while (n > 3) {
      // Find the (remaining) vertex with the sharpest angle.
      uint32_t bestI = first;
      float bestAngle = angle_at_vert(first, points2D, prev, next);
      for (uint32_t i = next[first]; i != first; i = next[i]) {
        float angle = angle_at_vert(i, points2D, prev, next);
        if (angle < bestAngle) {
          bestI = i;
          bestAngle = angle;
        }
      }

      // Clip the triangle at bestI.
      uint32_t nextI = next[bestI];
      uint32_t prevI = prev[bestI];

      dst[0] = indices[bestI];
      dst[1] = indices[nextI];
      dst[2] = indices[prevI];
      dst += 3;

      if (bestI == first) {
        first = nextI;
      }
      next[prevI] = nextI;
      prev[nextI] = prevI;
      --n;
    }

    // Add the final triangle.
    dst[0] = indices[first];
    dst[1] = indices[next[first]];
    dst[2] = indices[prev[first]];

    return n - 2;
  }